

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall String::join(String *this,List<String> *tokens,char separator)

{
  Item *pIVar1;
  usize copyLength;
  Data *pDVar2;
  Item *str;
  
  clear(this);
  if ((tokens->endItem).prev != (Item *)0x0) {
    pIVar1 = (tokens->_end).item;
    str = (tokens->_begin).item;
    while( true ) {
      append(this,&str->value);
      str = str->next;
      if (str == pIVar1) break;
      copyLength = this->data->len;
      detach(this,copyLength,copyLength + 1);
      this->data->str[this->data->len] = separator;
      pDVar2 = this->data;
      pDVar2->len = copyLength + 1;
      pDVar2->str[copyLength + 1] = '\0';
    }
  }
  return this;
}

Assistant:

String& String::join(const List<String>& tokens, char separator)
{
  clear();
  if(!tokens.isEmpty())
    for(List<String>::Iterator i = tokens.begin(), end = tokens.end();;)
    {
      append(*i);
      if(++i == end)
        break;
      append(separator);
    }
  return *this;
}